

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

string * __thiscall
absl::lts_20250127::WebSafeBase64Escape_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,string_view src)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strings_internal::Base64EscapeInternal<std::__cxx11::string>
            ((uchar *)src._M_len,(size_t)this,__return_storage_ptr__,false,
             "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_");
  return __return_storage_ptr__;
}

Assistant:

std::string WebSafeBase64Escape(absl::string_view src) {
  std::string dest;
  strings_internal::Base64EscapeInternal(
      reinterpret_cast<const unsigned char*>(src.data()), src.size(), &dest,
      false, strings_internal::kWebSafeBase64Chars);
  return dest;
}